

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyParser.cpp
# Opt level: O0

bool Assimp::PLY::PropertyInstance::ParseValue(char **pCur,EDataType eType,ValueUnion *out)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  ValueUnion local_30;
  double d;
  ai_real f;
  bool ret;
  ValueUnion *out_local;
  char **ppcStack_10;
  EDataType eType_local;
  char **pCur_local;
  
  _f = out;
  out_local._4_4_ = eType;
  ppcStack_10 = pCur;
  if (*pCur == (char *)0x0) {
    __assert_fail("__null != pCur",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Ply/PlyParser.cpp"
                  ,0x3ab,
                  "static bool Assimp::PLY::PropertyInstance::ParseValue(const char *&, PLY::EDataType, PLY::PropertyInstance::ValueUnion *)"
                 );
  }
  if (out != (ValueUnion *)0x0) {
    d._7_1_ = 1;
    switch(eType) {
    case EDT_Char:
    case EDT_Short:
    case EDT_Int:
      iVar2 = strtol10(*pCur,pCur);
      _f->iInt = iVar2;
      break;
    case EDT_UChar:
    case EDT_UShort:
    case EDT_UInt:
      uVar1 = strtoul10(*pCur,pCur);
      _f->iUInt = uVar1;
      break;
    case EDT_Float:
      pcVar3 = fast_atoreal_move<float>(*pCur,(float *)&d,true);
      *ppcStack_10 = pcVar3;
      _f->iUInt = d._0_4_;
      break;
    case EDT_Double:
      pcVar3 = fast_atoreal_move<double>(*pCur,&local_30.fDouble,true);
      *ppcStack_10 = pcVar3;
      *_f = local_30;
      break;
    case EDT_INVALID:
    default:
      d._7_1_ = 0;
    }
    return (bool)(d._7_1_ & 1);
  }
  __assert_fail("__null != out",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Ply/PlyParser.cpp"
                ,0x3ac,
                "static bool Assimp::PLY::PropertyInstance::ParseValue(const char *&, PLY::EDataType, PLY::PropertyInstance::ValueUnion *)"
               );
}

Assistant:

bool PLY::PropertyInstance::ParseValue(const char* &pCur,
  PLY::EDataType eType,
  PLY::PropertyInstance::ValueUnion* out)
{
  ai_assert(NULL != pCur);
  ai_assert(NULL != out);

  //calc element size
  bool ret = true;
  switch (eType)
  {
  case EDT_UInt:
  case EDT_UShort:
  case EDT_UChar:

    out->iUInt = (uint32_t)strtoul10(pCur, &pCur);
    break;

  case EDT_Int:
  case EDT_Short:
  case EDT_Char:

    out->iInt = (int32_t)strtol10(pCur, &pCur);
    break;

  case EDT_Float:
    // technically this should cast to float, but people tend to use float descriptors for double data
    // this is the best way to not risk losing precision on import and it doesn't hurt to do this
    ai_real f;
    pCur = fast_atoreal_move<ai_real>(pCur, f);
    out->fFloat = (ai_real)f;
    break;

  case EDT_Double:
    double d;
    pCur = fast_atoreal_move<double>(pCur, d);
    out->fDouble = (double)d;
    break;

  case EDT_INVALID:
  default:
    ret = false;
    break;
  }

  return ret;
}